

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O2

bool cmCMakePresetsGraphInternal::PresetBoolHelper(bool *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  code *local_38 [2];
  code *local_28;
  code *local_20;
  
  if (PresetBoolHelper(bool&,Json::Value_const*,cmJSONState*)::helper == '\0') {
    iVar2 = __cxa_guard_acquire(&PresetBoolHelper(bool&,Json::Value_const*,cmJSONState*)::helper);
    if (iVar2 != 0) {
      local_38[1] = (code *)0x0;
      local_38[0] = JsonErrors::INVALID_BOOL;
      local_20 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_invoke;
      local_28 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_manager;
      cmJSONHelperBuilder::Bool(&PresetBoolHelper::helper,(ErrorGenerator *)local_38,false);
      std::_Function_base::~_Function_base((_Function_base *)local_38);
      __cxa_atexit(std::_Function_base::~_Function_base,&PresetBoolHelper::helper,&__dso_handle);
      __cxa_guard_release(&PresetBoolHelper(bool&,Json::Value_const*,cmJSONState*)::helper);
    }
  }
  bVar1 = std::function<bool_(bool_&,_const_Json::Value_*,_cmJSONState_*)>::operator()
                    (&PresetBoolHelper::helper,out,value,state);
  return bVar1;
}

Assistant:

bool PresetBoolHelper(bool& out, const Json::Value* value, cmJSONState* state)
{
  static auto const helper = JSONHelperBuilder::Bool();
  return helper(out, value, state);
}